

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
Splay::queryLower(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Splay *this,
                 double x)

{
  int iVar1;
  pair<Node_*,_bool> pVar2;
  allocator<double> local_71;
  value_type local_70;
  Node *local_68;
  Node *nxtp;
  undefined1 local_58;
  Node *local_50;
  pair<Node_*,_bool> nxt;
  allocator<double> local_29;
  value_type local_28;
  double local_20;
  double x_local;
  Splay *this_local;
  
  local_20 = x;
  x_local = (double)this;
  this_local = (Splay *)__return_storage_ptr__;
  if (this->rt == (Node *)0x0) {
    iVar1 = this->momentN;
    local_28 = 0.0;
    std::allocator<double>::allocator(&local_29);
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,(long)(iVar1 + 1),&local_28,&local_29);
    std::allocator<double>::~allocator(&local_29);
  }
  else {
    pVar2 = nextX(this,this->rt,x);
    local_68 = pVar2.first;
    local_58 = pVar2.second;
    nxtp = local_68;
    local_50 = local_68;
    nxt.first._0_1_ = local_58;
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::vector<double,_std::allocator<double>_>::vector
                (__return_storage_ptr__,&this->rt->moments);
    }
    else {
      splay(this,local_68,(Node *)0x0);
      if (local_68->ch[0] == (Node *)0x0) {
        iVar1 = this->momentN;
        local_70 = 0.0;
        std::allocator<double>::allocator(&local_71);
        std::vector<double,_std::allocator<double>_>::vector
                  (__return_storage_ptr__,(long)(iVar1 + 1),&local_70,&local_71);
        std::allocator<double>::~allocator(&local_71);
      }
      else {
        std::vector<double,_std::allocator<double>_>::vector
                  (__return_storage_ptr__,&local_68->ch[0]->moments);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> queryLower(double x) {
        if (rt == nullptr) {
            return vector<double>(momentN + 1, 0.0);
        }
        pair<Node *, bool> nxt = nextX(rt, x);
        if (!nxt.second) {
            return rt->moments;
        }
        Node *nxtp = nxt.first;
        splay(nxtp);
        if (nxtp->ch[0]) {
            return nxtp->ch[0]->moments;
        } else {
            return vector<double>(momentN + 1, 0.0);
        }
    }